

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlParseContentInternal(htmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *newtag;
  bool bVar2;
  xmlChar *name;
  xmlChar *pxStack_18;
  int depth;
  xmlChar *currentNode;
  htmlParserCtxtPtr ctxt_local;
  
  pxStack_18 = xmlStrdup(ctxt->name);
  name._4_4_ = ctxt->nameNr;
LAB_0015c6dd:
  while( true ) {
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015ccc5;
    if ((*ctxt->input->cur != '<') || (ctxt->input->cur[1] != '/')) break;
    iVar1 = htmlParseEndTag(ctxt);
    if ((iVar1 != 0) && ((pxStack_18 != (xmlChar *)0x0 || (ctxt->nameNr == 0)))) {
      if (pxStack_18 != (xmlChar *)0x0) {
        (*xmlFree)(pxStack_18);
      }
      pxStack_18 = xmlStrdup(ctxt->name);
      name._4_4_ = ctxt->nameNr;
    }
  }
  if ((*ctxt->input->cur == '<') &&
     ((((0x40 < ctxt->input->cur[1] && (ctxt->input->cur[1] < 0x5b)) ||
       ((0x60 < ctxt->input->cur[1] && (ctxt->input->cur[1] < 0x7b)))) ||
      ((ctxt->input->cur[1] == '_' || (ctxt->input->cur[1] == ':')))))) {
    newtag = htmlParseHTMLName_nonInvasive(ctxt);
    if (newtag == (xmlChar *)0x0) {
      htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseStartTag: invalid element name\n",
                   (xmlChar *)0x0,(xmlChar *)0x0);
      while( true ) {
        bVar2 = false;
        if (*ctxt->input->cur == '\0') {
          bVar2 = *ctxt->input->cur != '>';
        }
        if (!bVar2) break;
        xmlNextChar(ctxt);
      }
      htmlParserFinishElementParsing(ctxt);
      if (pxStack_18 != (xmlChar *)0x0) {
        (*xmlFree)(pxStack_18);
      }
      pxStack_18 = xmlStrdup(ctxt->name);
      name._4_4_ = ctxt->nameNr;
      goto LAB_0015c6dd;
    }
    if ((ctxt->name != (xmlChar *)0x0) &&
       (iVar1 = htmlCheckAutoClose(newtag,ctxt->name), iVar1 == 1)) {
      htmlAutoClose(ctxt,newtag);
      goto LAB_0015c6dd;
    }
  }
  if (((ctxt->nameNr < 1) || (name._4_4_ < ctxt->nameNr)) ||
     (iVar1 = xmlStrEqual(pxStack_18,ctxt->name), iVar1 != 0)) {
    if ((*ctxt->input->cur == '\0') ||
       ((iVar1 = xmlStrEqual(pxStack_18,"script"), iVar1 == 0 &&
        (iVar1 = xmlStrEqual(pxStack_18,"style"), iVar1 == 0)))) {
      if ((*ctxt->input->cur == '<') &&
         (((ctxt->input->cur[1] == '!' &&
           (iVar1 = toupper((uint)ctxt->input->cur[2]), iVar1 == 0x44)) &&
          ((iVar1 = toupper((uint)ctxt->input->cur[3]), iVar1 == 0x4f &&
           ((((iVar1 = toupper((uint)ctxt->input->cur[4]), iVar1 == 0x43 &&
              (iVar1 = toupper((uint)ctxt->input->cur[5]), iVar1 == 0x54)) &&
             (iVar1 = toupper((uint)ctxt->input->cur[6]), iVar1 == 0x59)) &&
            ((iVar1 = toupper((uint)ctxt->input->cur[7]), iVar1 == 0x50 &&
             (iVar1 = toupper((uint)ctxt->input->cur[8]), iVar1 == 0x45)))))))))) {
        htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"Misplaced DOCTYPE declaration\n",
                     (xmlChar *)"DOCTYPE",(xmlChar *)0x0);
        htmlParseDocTypeDecl(ctxt);
      }
      if (((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) &&
         ((ctxt->input->cur[2] == '-' && (ctxt->input->cur[3] == '-')))) {
        htmlParseComment(ctxt);
      }
      else if ((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '?')) {
        htmlParsePI(ctxt);
      }
      else if (*ctxt->input->cur == '<') {
        htmlParseElementInternal(ctxt);
        if (pxStack_18 != (xmlChar *)0x0) {
          (*xmlFree)(pxStack_18);
        }
        pxStack_18 = xmlStrdup(ctxt->name);
        name._4_4_ = ctxt->nameNr;
      }
      else if (*ctxt->input->cur == '&') {
        htmlParseReference(ctxt);
      }
      else {
        if (*ctxt->input->cur == '\0') {
          htmlAutoCloseOnEnd(ctxt);
LAB_0015ccc5:
          if (pxStack_18 != (xmlChar *)0x0) {
            (*xmlFree)(pxStack_18);
          }
          return;
        }
        htmlParseCharData(ctxt);
      }
    }
    else {
      htmlParseScript(ctxt);
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
  }
  else {
    htmlParserFinishElementParsing(ctxt);
    if (pxStack_18 != (xmlChar *)0x0) {
      (*xmlFree)(pxStack_18);
    }
    pxStack_18 = xmlStrdup(ctxt->name);
    name._4_4_ = ctxt->nameNr;
  }
  goto LAB_0015c6dd;
}

Assistant:

static void
htmlParseContentInternal(htmlParserCtxtPtr ctxt) {
    xmlChar *currentNode;
    int depth;
    const xmlChar *name;

    currentNode = xmlStrdup(ctxt->name);
    depth = ctxt->nameNr;
    while (1) {
        GROW;

        if (ctxt->instate == XML_PARSER_EOF)
            break;

	/*
	 * Our tag or one of it's parent or children is ending.
	 */
        if ((CUR == '<') && (NXT(1) == '/')) {
	    if (htmlParseEndTag(ctxt) &&
		((currentNode != NULL) || (ctxt->nameNr == 0))) {
		if (currentNode != NULL)
		    xmlFree(currentNode);

	        currentNode = xmlStrdup(ctxt->name);
	        depth = ctxt->nameNr;
	    }
	    continue; /* while */
        }

	else if ((CUR == '<') &&
	         ((IS_ASCII_LETTER(NXT(1))) ||
		  (NXT(1) == '_') || (NXT(1) == ':'))) {
	    name = htmlParseHTMLName_nonInvasive(ctxt);
	    if (name == NULL) {
	        htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
			 "htmlParseStartTag: invalid element name\n",
			 NULL, NULL);
	        /* Dump the bogus tag like browsers do */
	        while ((CUR == 0) && (CUR != '>'))
	            NEXT;

	        htmlParserFinishElementParsing(ctxt);
	        if (currentNode != NULL)
	            xmlFree(currentNode);

	        currentNode = xmlStrdup(ctxt->name);
	        depth = ctxt->nameNr;
	        continue;
	    }

	    if (ctxt->name != NULL) {
	        if (htmlCheckAutoClose(name, ctxt->name) == 1) {
	            htmlAutoClose(ctxt, name);
	            continue;
	        }
	    }
	}

	/*
	 * Has this node been popped out during parsing of
	 * the next element
	 */
        if ((ctxt->nameNr > 0) && (depth >= ctxt->nameNr) &&
	    (!xmlStrEqual(currentNode, ctxt->name)))
	     {
	    htmlParserFinishElementParsing(ctxt);
	    if (currentNode != NULL) xmlFree(currentNode);

	    currentNode = xmlStrdup(ctxt->name);
	    depth = ctxt->nameNr;
	    continue;
	}

	if ((CUR != 0) && ((xmlStrEqual(currentNode, BAD_CAST"script")) ||
	    (xmlStrEqual(currentNode, BAD_CAST"style")))) {
	    /*
	     * Handle SCRIPT/STYLE separately
	     */
	    htmlParseScript(ctxt);
	} else {
	    /*
	     * Sometimes DOCTYPE arrives in the middle of the document
	     */
	    if ((CUR == '<') && (NXT(1) == '!') &&
		(UPP(2) == 'D') && (UPP(3) == 'O') &&
		(UPP(4) == 'C') && (UPP(5) == 'T') &&
		(UPP(6) == 'Y') && (UPP(7) == 'P') &&
		(UPP(8) == 'E')) {
		htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
		             "Misplaced DOCTYPE declaration\n",
			     BAD_CAST "DOCTYPE" , NULL);
		htmlParseDocTypeDecl(ctxt);
	    }

	    /*
	     * First case :  a comment
	     */
	    if ((CUR == '<') && (NXT(1) == '!') &&
		(NXT(2) == '-') && (NXT(3) == '-')) {
		htmlParseComment(ctxt);
	    }

	    /*
	     * Second case : a Processing Instruction.
	     */
	    else if ((CUR == '<') && (NXT(1) == '?')) {
		htmlParsePI(ctxt);
	    }

	    /*
	     * Third case :  a sub-element.
	     */
	    else if (CUR == '<') {
		htmlParseElementInternal(ctxt);
		if (currentNode != NULL) xmlFree(currentNode);

		currentNode = xmlStrdup(ctxt->name);
		depth = ctxt->nameNr;
	    }

	    /*
	     * Fourth case : a reference. If if has not been resolved,
	     *    parsing returns it's Name, create the node
	     */
	    else if (CUR == '&') {
		htmlParseReference(ctxt);
	    }

	    /*
	     * Fifth case : end of the resource
	     */
	    else if (CUR == 0) {
		htmlAutoCloseOnEnd(ctxt);
		break;
	    }

	    /*
	     * Last case, text. Note that References are handled directly.
	     */
	    else {
		htmlParseCharData(ctxt);
	    }
	}
        GROW;
    }
    if (currentNode != NULL) xmlFree(currentNode);
}